

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O3

int __thiscall TPZFNMatrix<50,_double>::ClassId(TPZFNMatrix<50,_double> *this)

{
  uint uVar1;
  int iVar2;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TPZFNMatrix","");
  uVar1 = Hash(&local_40);
  iVar2 = TPZFMatrix<double>::ClassId(&this->super_TPZFMatrix<double>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return uVar1 ^ iVar2 * 2 ^ 200;
}

Assistant:

int TPZFNMatrix<N, TVar>::ClassId() const{
    return Hash("TPZFNMatrix") ^ TPZFMatrix<TVar>::ClassId() << 1 ^ (N << 2);
}